

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

int Cof_ManTfoSize(Cof_Man_t *p,Cof_Obj_t **ppObjs,int nObjs)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  p->nTravIds = p->nTravIds + 1;
  uVar4 = 0;
  uVar2 = (ulong)(uint)nObjs;
  if (nObjs < 1) {
    uVar2 = uVar4;
  }
  iVar3 = 0;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = Cof_ManTfoSize_rec(p,ppObjs[uVar4]);
    iVar3 = iVar3 + iVar1 + -1;
  }
  return iVar3;
}

Assistant:

int Cof_ManTfoSize( Cof_Man_t * p, Cof_Obj_t ** ppObjs, int nObjs )
{
    int i, Counter = 0; 
    Cof_ManIncrementTravId( p );
    for ( i = 0; i < nObjs; i++ )
        Counter += Cof_ManTfoSize_rec( p, ppObjs[i] ) - 1;
    return Counter;
}